

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall LLVMBC::ModuleParseContext::add_value(ModuleParseContext *this,Value *value)

{
  pointer *pppVVar1;
  uint64_t id;
  iterator __position;
  TypeID TVar2;
  Type *this_00;
  Value *local_10;
  
  local_10 = value;
  this_00 = Value::getType(value);
  TVar2 = Type::getTypeID(this_00);
  if (TVar2 != VoidTyID) {
    id = this->tween_id;
    this->tween_id = id + 1;
    Value::set_tween_id(local_10,id);
    __position._M_current =
         (this->values).
         super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->values).
        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
      _M_realloc_insert<LLVMBC::Value*const&>
                ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)
                 &this->values,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppVVar1 = &(this->values).
                  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
  }
  return true;
}

Assistant:

bool ModuleParseContext::add_value(Value *value)
{
	if (value->getType()->getTypeID() != Type::TypeID::VoidTyID)
	{
		value->set_tween_id(tween_id++);
		values.push_back(value);
	}
	return true;
}